

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xxhash.h
# Opt level: O3

XXH64_hash_t XXH3_mergeAccs(xxh_u64 *acc,xxh_u8 *secret,xxh_u64 start)

{
  ulong *puVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  xxh_u64 result64;
  ulong uVar6;
  long lVar7;
  long lVar8;
  
  lVar8 = 0;
  lVar7 = 0;
  do {
    puVar1 = (ulong *)((long)acc + lVar7 + 0x10);
    auVar2._8_8_ = 0;
    auVar2._0_8_ = ((ulong *)((long)acc + lVar7))[1] ^ *(ulong *)((long)(secret + lVar7) + 8);
    auVar4._8_8_ = 0;
    auVar4._0_8_ = *(ulong *)((long)acc + lVar7) ^ *(ulong *)(secret + lVar7);
    auVar3._8_8_ = 0;
    auVar3._0_8_ = puVar1[1] ^ *(ulong *)((long)(secret + lVar7 + 0x10) + 8);
    auVar5._8_8_ = 0;
    auVar5._0_8_ = *puVar1 ^ *(ulong *)(secret + lVar7 + 0x10);
    start = start + (SUB168(auVar2 * auVar4,8) ^ SUB168(auVar2 * auVar4,0));
    lVar8 = lVar8 + (SUB168(auVar3 * auVar5,8) ^ SUB168(auVar3 * auVar5,0));
    lVar7 = lVar7 + 0x20;
  } while (lVar7 != 0x40);
  uVar6 = (lVar8 + start >> 0x25 ^ lVar8 + start) * 0x165667919e3779f9;
  return uVar6 >> 0x20 ^ uVar6;
}

Assistant:

static XXH64_hash_t
XXH3_mergeAccs(const xxh_u64* XXH_RESTRICT acc, const xxh_u8* XXH_RESTRICT secret, xxh_u64 start)
{
    xxh_u64 result64 = start;
    size_t i = 0;

    for (i = 0; i < 4; i++) {
        result64 += XXH3_mix2Accs(acc+2*i, secret + 16*i);
#if defined(__clang__)                                /* Clang */ \
    && (defined(__arm__) || defined(__thumb__))       /* ARMv7 */ \
    && (defined(__ARM_NEON) || defined(__ARM_NEON__)) /* NEON */  \
    && !defined(XXH_ENABLE_AUTOVECTORIZE)             /* Define to disable */
        /*
         * UGLY HACK:
         * Prevent autovectorization on Clang ARMv7-a. Exact same problem as
         * the one in XXH3_len_129to240_64b. Speeds up shorter keys > 240b.
         * XXH3_64bits, len == 256, Snapdragon 835:
         *   without hack: 2063.7 MB/s
         *   with hack:    2560.7 MB/s
         */
        XXH_COMPILER_GUARD(result64);
#endif
    }

    return XXH3_avalanche(result64);
}